

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space_factory.h
# Opt level: O0

shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> __thiscall
projects::dpg::ProductUniformFESpaceFactory<double>::ReferenceFiniteElement
          (ProductUniformFESpaceFactory<double> *this,RefEl ref_el,size_type degree)

{
  RefElType RVar1;
  ostream *poVar2;
  uint in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000031;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> sVar4;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  string local_a50;
  allocator<char> local_a29;
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  stringstream local_9e0 [8];
  stringstream ss_3;
  ostream local_9d0 [376];
  shared_ptr<lf::fe::FePoint<double>_> local_858;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  stringstream local_760 [8];
  stringstream ss_2;
  ostream local_750 [376];
  shared_ptr<lf::uscalfe::FeLagrangeO3Segment<double>_> local_5d8;
  shared_ptr<lf::uscalfe::FeLagrangeO2Segment<double>_> local_5c8;
  shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_> local_5b8;
  shared_ptr<projects::dpg::FeDiscontinuousO0Segment<double>_> local_5a8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  stringstream local_4b0 [8];
  stringstream ss_1;
  ostream local_4a0 [376];
  shared_ptr<lf::uscalfe::FeLagrangeO3Quad<double>_> local_328;
  shared_ptr<lf::uscalfe::FeLagrangeO2Quad<double>_> local_318;
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_> local_308;
  shared_ptr<projects::dpg::FeDiscontinuousO0Quad<double>_> local_2f8;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [376];
  shared_ptr<lf::uscalfe::FeLagrangeO3Tria<double>_> local_68;
  shared_ptr<lf::uscalfe::FeLagrangeO2Tria<double>_> local_58;
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_> local_48;
  shared_ptr<projects::dpg::FeDiscontinuousO0Tria<double>_> local_38;
  uint local_24;
  undefined8 uStack_20;
  size_type degree_local;
  ProductUniformFESpaceFactory<double> *this_local;
  ProductUniformFESpaceFactory<double> *pPStack_10;
  RefEl ref_el_local;
  
  uStack_20 = CONCAT71(in_register_00000031,ref_el.type_);
  this_local._7_1_ = (undefined1)degree;
  local_24 = in_ECX;
  pPStack_10 = this;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 7));
  switch(RVar1) {
  case kPoint:
    std::make_shared<lf::fe::FePoint<double>,unsigned_int&>((uint *)&local_858);
    std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
    shared_ptr<lf::fe::FePoint<double>,void>
              ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_858);
    std::shared_ptr<lf::fe::FePoint<double>_>::~shared_ptr(&local_858);
    _Var3._M_pi = extraout_RDX_11;
    break;
  case kSegment:
    switch(local_24) {
    case 0:
      std::make_shared<projects::dpg::FeDiscontinuousO0Segment<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<projects::dpg::FeDiscontinuousO0Segment<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_5a8);
      std::shared_ptr<projects::dpg::FeDiscontinuousO0Segment<double>_>::~shared_ptr(&local_5a8);
      _Var3._M_pi = extraout_RDX_07;
      break;
    case 1:
      std::make_shared<lf::uscalfe::FeLagrangeO1Segment<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_5b8);
      std::shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_>::~shared_ptr(&local_5b8);
      _Var3._M_pi = extraout_RDX_08;
      break;
    case 2:
      std::make_shared<lf::uscalfe::FeLagrangeO2Segment<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO2Segment<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_5c8);
      std::shared_ptr<lf::uscalfe::FeLagrangeO2Segment<double>_>::~shared_ptr(&local_5c8);
      _Var3._M_pi = extraout_RDX_09;
      break;
    case 3:
      std::make_shared<lf::uscalfe::FeLagrangeO3Segment<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO3Segment<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_5d8);
      std::shared_ptr<lf::uscalfe::FeLagrangeO3Segment<double>_>::~shared_ptr(&local_5d8);
      _Var3._M_pi = extraout_RDX_10;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_760);
      poVar2 = std::operator<<(local_750,"no fe of degree ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
      poVar2 = std::operator<<(poVar2,"available on ref_el ");
      lf::base::operator<<(poVar2,(RefEl *)((long)&this_local + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"false",&local_781);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_7a9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_780,&local_7a8,0xce,&local_7d0);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::allocator<char>::~allocator(&local_7a9);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"false",&local_7f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_819);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"",&local_841);
      lf::base::AssertionFailed(&local_7f0,&local_818,0xce,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator(&local_841);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
      abort();
    }
    break;
  case kTria:
    switch(local_24) {
    case 0:
      std::make_shared<projects::dpg::FeDiscontinuousO0Tria<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<projects::dpg::FeDiscontinuousO0Tria<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_38);
      std::shared_ptr<projects::dpg::FeDiscontinuousO0Tria<double>_>::~shared_ptr(&local_38);
      _Var3._M_pi = extraout_RDX;
      break;
    case 1:
      std::make_shared<lf::uscalfe::FeLagrangeO1Tria<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_48);
      std::shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_>::~shared_ptr(&local_48);
      _Var3._M_pi = extraout_RDX_00;
      break;
    case 2:
      std::make_shared<lf::uscalfe::FeLagrangeO2Tria<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO2Tria<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_58);
      std::shared_ptr<lf::uscalfe::FeLagrangeO2Tria<double>_>::~shared_ptr(&local_58);
      _Var3._M_pi = extraout_RDX_01;
      break;
    case 3:
      std::make_shared<lf::uscalfe::FeLagrangeO3Tria<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO3Tria<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_68);
      std::shared_ptr<lf::uscalfe::FeLagrangeO3Tria<double>_>::~shared_ptr(&local_68);
      _Var3._M_pi = extraout_RDX_02;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar2 = std::operator<<(local_1e0,"no fe of degree ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
      poVar2 = std::operator<<(poVar2," available on ref_el ");
      lf::base::operator<<(poVar2,(RefEl *)((long)&this_local + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"false",&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_249);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_220,&local_248,0xae,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"false",&local_291);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_2b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
      lf::base::AssertionFailed(&local_290,&local_2b8,0xae,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      abort();
    }
    break;
  case kQuad:
    switch(local_24) {
    case 0:
      std::make_shared<projects::dpg::FeDiscontinuousO0Quad<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<projects::dpg::FeDiscontinuousO0Quad<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_2f8);
      std::shared_ptr<projects::dpg::FeDiscontinuousO0Quad<double>_>::~shared_ptr(&local_2f8);
      _Var3._M_pi = extraout_RDX_03;
      break;
    case 1:
      std::make_shared<lf::uscalfe::FeLagrangeO1Quad<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_308);
      std::shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_>::~shared_ptr(&local_308);
      _Var3._M_pi = extraout_RDX_04;
      break;
    case 2:
      std::make_shared<lf::uscalfe::FeLagrangeO2Quad<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO2Quad<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_318);
      std::shared_ptr<lf::uscalfe::FeLagrangeO2Quad<double>_>::~shared_ptr(&local_318);
      _Var3._M_pi = extraout_RDX_05;
      break;
    case 3:
      std::make_shared<lf::uscalfe::FeLagrangeO3Quad<double>>();
      std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
      shared_ptr<lf::uscalfe::FeLagrangeO3Quad<double>,void>
                ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)this,&local_328);
      std::shared_ptr<lf::uscalfe::FeLagrangeO3Quad<double>_>::~shared_ptr(&local_328);
      _Var3._M_pi = extraout_RDX_06;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_4b0);
      poVar2 = std::operator<<(local_4a0,"no fe of degree ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
      poVar2 = std::operator<<(poVar2,"available on ref_el ");
      lf::base::operator<<(poVar2,(RefEl *)((long)&this_local + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"false",&local_4d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_4f9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_4d0,&local_4f8,0xbe,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"false",&local_541);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
                 ,&local_569);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"",&local_591);
      lf::base::AssertionFailed(&local_540,&local_568,0xbe,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      abort();
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_9e0);
    poVar2 = std::operator<<(local_9d0,"unsupported reference element ");
    lf::base::operator<<(poVar2,(RefEl *)((long)&this_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"false",&local_a01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a28,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
               ,&local_a29);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_a00,&local_a28,0xd5,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_a28);
    std::allocator<char>::~allocator(&local_a29);
    std::__cxx11::string::~string((string *)&local_a00);
    std::allocator<char>::~allocator(&local_a01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"false",&local_a71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a98,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space_factory.h"
               ,&local_a99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"",&local_ac1);
    lf::base::AssertionFailed(&local_a70,&local_a98,0xd5,&local_ac0);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator(&local_ac1);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator(&local_a99);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator(&local_a71);
    abort();
  }
  sVar4.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar4.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>)
         sVar4.
         super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
ProductUniformFESpaceFactory<SCALAR>::ReferenceFiniteElement(
    lf::base::RefEl ref_el, size_type degree) {
  switch (ref_el) {
    case (lf::base::RefEl::kTria()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Tria<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Tria<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Tria<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Tria<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << " available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kQuad()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Quad<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Quad<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Quad<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Quad<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << "available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kSegment()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Segment<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Segment<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Segment<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Segment<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << "available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kPoint()): {
      return std::make_shared<lf::fe::FePoint<SCALAR>>(degree);
    }
    default: {
      LF_ASSERT_MSG(false, "unsupported reference element " << ref_el);
      return nullptr;
    }
  }
}